

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<int,unsigned_char,unsigned_char>
          (InternalException *this,string *msg,int params,uchar params_1,uchar params_2)

{
  undefined3 in_register_00000009;
  undefined4 in_register_00000014;
  uchar in_R9B;
  string local_30;
  
  Exception::ConstructMessage<int,unsigned_char,unsigned_char>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),
             CONCAT31(in_register_00000009,params_1),params_2,in_R9B);
  InternalException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}